

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void anon_unknown.dwarf_5db41::import_arg_group_global(void)

{
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"profile",&local_49);
  std::__cxx11::string::string
            ((string *)&local_48,
             "Vorpaline mode (scan, convert, repair, heal, cad, tet, poly, hex, quad)",&local_4a);
  GEO::CmdLine::declare_arg(&local_28,"scan",&local_48,ARG_FLAGS_DEFAULT);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"debug",&local_49);
  std::__cxx11::string::string((string *)&local_48,"Toggles debug mode",&local_4a);
  GEO::CmdLine::declare_arg(&local_28,false,&local_48,ARG_ADVANCED);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void import_arg_group_global() {
        declare_arg(
            "profile", "scan",
            "Vorpaline mode "
	    "(scan, convert, repair, heal, cad, tet, poly, hex, quad)"
        );
        declare_arg(
            "debug", false,
            "Toggles debug mode", ARG_ADVANCED
        );
    }